

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_compress_advanced
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,ZSTD_parameters params)

{
  ZSTD_useRowMatchFinderMode_e ZVar1;
  size_t sVar2;
  
  sVar2 = ZSTD_checkCParams(params.cParams);
  if (sVar2 < 0xffffffffffffff89) {
    memset(&cctx->simpleApiParams,0,0xb0);
    (cctx->simpleApiParams).cParams.windowLog = (int)params.cParams._0_8_;
    (cctx->simpleApiParams).cParams.chainLog = (int)((ulong)params.cParams._0_8_ >> 0x20);
    (cctx->simpleApiParams).cParams.hashLog = (int)params.cParams._8_8_;
    (cctx->simpleApiParams).cParams.searchLog = (int)((ulong)params.cParams._8_8_ >> 0x20);
    (cctx->simpleApiParams).cParams.searchLog = (int)params.cParams._12_8_;
    (cctx->simpleApiParams).cParams.minMatch = (int)((ulong)params.cParams._12_8_ >> 0x20);
    (cctx->simpleApiParams).cParams.targetLength = (int)params.cParams._20_8_;
    (cctx->simpleApiParams).cParams.strategy = (int)((ulong)params.cParams._20_8_ >> 0x20);
    (cctx->simpleApiParams).fParams.contentSizeFlag = params.fParams.contentSizeFlag;
    (cctx->simpleApiParams).fParams.checksumFlag = params.fParams.checksumFlag;
    (cctx->simpleApiParams).fParams.noDictIDFlag = params.fParams.noDictIDFlag;
    (cctx->simpleApiParams).compressionLevel = 0;
    ZVar1 = (cctx->simpleApiParams).useRowMatchFinder;
    if ((ZVar1 == ZSTD_urm_auto) &&
       (ZVar1 = ZSTD_urm_disableRowMatchFinder, 0xfffffffc < params.cParams.strategy - ZSTD_btlazy2)
       ) {
      ZVar1 = ZSTD_urm_enableRowMatchFinder - (params.cParams.windowLog < 0xf);
    }
    (cctx->simpleApiParams).useRowMatchFinder = ZVar1;
    sVar2 = ZSTD_compress_advanced_internal
                      (cctx,dst,dstCapacity,src,srcSize,dict,dictSize,&cctx->simpleApiParams);
  }
  return sVar2;
}

Assistant:

size_t ZSTD_compress_advanced (ZSTD_CCtx* cctx,
                               void* dst, size_t dstCapacity,
                         const void* src, size_t srcSize,
                         const void* dict,size_t dictSize,
                               ZSTD_parameters params)
{
    DEBUGLOG(4, "ZSTD_compress_advanced");
    FORWARD_IF_ERROR(ZSTD_checkCParams(params.cParams), "");
    ZSTD_CCtxParams_init_internal(&cctx->simpleApiParams, &params, ZSTD_NO_CLEVEL);
    return ZSTD_compress_advanced_internal(cctx,
                                           dst, dstCapacity,
                                           src, srcSize,
                                           dict, dictSize,
                                           &cctx->simpleApiParams);
}